

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O1

string * pad_or_truncate_password_V4(string *__return_storage_ptr__,string *password)

{
  pointer pcVar1;
  ulong __n;
  size_type __dnew;
  char k1 [32];
  size_type local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  __n = password->_M_string_length;
  if (0x1f < __n) {
    __n = 0x20;
  }
  memcpy(&local_48,(password->_M_dataplus)._M_p,__n);
  memcpy((void *)((long)&local_48 + __n),padding_string,0x20 - __n);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  local_50 = 0x20;
  pcVar1 = (pointer)std::__cxx11::string::_M_create
                              ((ulong *)__return_storage_ptr__,(ulong)&local_50);
  (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
  (__return_storage_ptr__->field_2)._M_allocated_capacity = local_50;
  *(undefined8 *)(pcVar1 + 0x10) = local_38;
  *(undefined8 *)(pcVar1 + 0x18) = uStack_30;
  *(undefined8 *)pcVar1 = local_48;
  *(undefined8 *)(pcVar1 + 8) = uStack_40;
  __return_storage_ptr__->_M_string_length = local_50;
  (__return_storage_ptr__->_M_dataplus)._M_p[local_50] = '\0';
  return __return_storage_ptr__;
}

Assistant:

static std::string
pad_or_truncate_password_V4(std::string const& password)
{
    char k1[key_bytes];
    pad_or_truncate_password_V4(password, k1);
    return {k1, key_bytes};
}